

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

string * __thiscall ghc::filesystem::path::string_abi_cxx11_(path *this)

{
  string_type *psVar1;
  path *in_RSI;
  string *in_RDI;
  
  psVar1 = native_abi_cxx11_(in_RSI);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  return in_RDI;
}

Assistant:

GHC_INLINE std::string path::string() const
{
#ifdef GHC_USE_WCHAR_T
    return detail::toUtf8(native());
#else
    return native();
#endif
}